

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmd_reader.h
# Opt level: O2

void cppwinrt::reader::parse_command_line<char>
               (char *cmdstart,
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *argv,size_t *argument_count)

{
  bool bVar1;
  char cVar2;
  bool bVar3;
  uint uVar4;
  int iVar5;
  char cVar6;
  char *pcVar7;
  char *pcVar8;
  string arg;
  
  arg._M_dataplus._M_p = (pointer)&arg.field_2;
  arg._M_string_length = 0;
  arg.field_2._M_local_buf[0] = '\0';
  *argument_count = 0;
  cVar2 = *cmdstart;
  bVar3 = true;
  bVar1 = false;
  while( true ) {
    if (cVar2 == '\0') {
      cVar2 = '\0';
    }
    else {
      while ((cVar2 == ' ' || (cVar2 == '\t'))) {
        pcVar7 = cmdstart + 1;
        cmdstart = cmdstart + 1;
        cVar2 = *pcVar7;
      }
    }
    if (!bVar3) {
      std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
      emplace_back<std::__cxx11::string&>
                ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)argv,&arg);
      arg._M_string_length = 0;
      *arg._M_dataplus._M_p = '\0';
      *argument_count = *argument_count + 1;
      cVar2 = *cmdstart;
    }
    if (cVar2 == '\0') break;
    while( true ) {
      uVar4 = 0;
      while( true ) {
        pcVar7 = cmdstart + 1;
        if (*cmdstart != '\\') break;
        uVar4 = uVar4 + 1;
        cmdstart = pcVar7;
      }
      if (*cmdstart == '\"') {
        bVar3 = true;
        pcVar8 = cmdstart;
        if (((uVar4 & 1) == 0) && ((!bVar1 || (pcVar8 = pcVar7, *pcVar7 != '\"')))) {
          bVar1 = (bool)(bVar1 ^ 1);
          bVar3 = false;
          pcVar8 = cmdstart;
        }
        uVar4 = uVar4 >> 1;
        cmdstart = pcVar8;
      }
      else {
        bVar3 = true;
      }
      iVar5 = uVar4 + 1;
      while( true ) {
        iVar5 = iVar5 + -1;
        cVar6 = (char)&arg;
        if (iVar5 == 0) break;
        std::__cxx11::string::push_back(cVar6);
      }
      cVar2 = *cmdstart;
      if ((cVar2 == '\0') || ((!bVar1 && ((cVar2 == '\t' || (cVar2 == ' ')))))) break;
      if (bVar3) {
        std::__cxx11::string::push_back(cVar6);
      }
      cmdstart = cmdstart + 1;
    }
    bVar3 = false;
  }
  std::__cxx11::string::~string((string *)&arg);
  return;
}

Assistant:

static void parse_command_line(Character* cmdstart, std::vector<std::string>& argv, size_t* argument_count)
        {

            std::string arg;
            bool copy_character;
            unsigned backslash_count;
            bool in_quotes;
            bool first_arg;

            Character* p = cmdstart;
            in_quotes = false;
            first_arg = true;
            *argument_count = 0;

            while (true)
            {
                if (*p)
                {
                    while (*p == ' ' || *p == '\t')
                        ++p;
                }

                if (!first_arg)
                {
                    argv.emplace_back(arg);
                    arg.clear();
                    ++*argument_count;
                }

                if (*p == '\0')
                    break;

                while (true)
                {
                    copy_character = true;

                    // Rules:
                    // 2N     backslashes   + " ==> N backslashes and begin/end quote
                    // 2N + 1 backslashes   + " ==> N backslashes + literal "
                    // N      backslashes       ==> N backslashes
                    backslash_count = 0;

                    while (*p == '\\')
                    {
                        ++p;
                        ++backslash_count;
                    }

                    if (*p == '"')
                    {
                        // if 2N backslashes before, start/end quote, otherwise
                        // copy literally:
                        if (backslash_count % 2 == 0)
                        {
                            if (in_quotes && p[1] == '"')
                            {
                                p++; // Double quote inside quoted string
                            }
                            else
                            {
                                // Skip first quote char and copy second:
                                copy_character = false;
                                in_quotes = !in_quotes;
                            }
                        }

                        backslash_count /= 2;
                    }

                    while (backslash_count--)
                    {
                        arg.push_back('\\');
                    }

                    if (*p == '\0' || (!in_quotes && (*p == ' ' || *p == '\t')))
                        break;

                    if (copy_character)
                    {
                        arg.push_back(*p);
                    }

                    ++p;
                }

                first_arg = false;
            }
        }